

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O3

int agent_sign(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len,
              void **abstract)

{
  undefined8 *puVar1;
  void *pvVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  int iVar6;
  uint32_t uVar7;
  int iVar8;
  undefined1 *puVar9;
  size_t *__dest;
  size_t sVar10;
  uchar *puVar11;
  char *pcVar12;
  ulong __n;
  ulong uVar13;
  uchar *local_50;
  size_t *local_48;
  uchar **local_40;
  LIBSSH2_SESSION *local_38;
  
  pvVar2 = *abstract;
  puVar1 = (undefined8 *)((long)pvVar2 + 0x18);
  if (*(int *)((long)pvVar2 + 0x38) == 0) {
    lVar3 = *(long *)((long)pvVar2 + 0x48);
    local_48 = sig_len;
    local_40 = sig;
    puVar9 = (undefined1 *)
             (*session->alloc)(data_len + *(long *)(lVar3 + 0x30) + 0xd,&session->abstract);
    *puVar1 = puVar9;
    if (puVar9 == (undefined1 *)0x0) {
      iVar6 = _libssh2_error(session,-6,"out of memory");
      return iVar6;
    }
    local_50 = puVar9 + 1;
    *puVar9 = 0xd;
    local_38 = session;
    _libssh2_store_str(&local_50,*(char **)(lVar3 + 0x28),*(size_t *)(lVar3 + 0x30));
    session = local_38;
    _libssh2_store_str(&local_50,(char *)data,data_len);
    sig_len = local_48;
    uVar7 = 0;
    if ((session->userauth_pblc_method_len != 0) &&
       (plVar4 = (long *)session->userauth_pblc_method, uVar7 = 0,
       session->userauth_pblc_method_len == 0xc && plVar4 != (long *)0x0)) {
      if ((int)plVar4[1] == 0x3231352d && *plVar4 == 0x326168732d617372) {
        uVar7 = 4;
      }
      else {
        uVar7 = (uint)((int)plVar4[1] == 0x3635322d && *plVar4 == 0x326168732d617372) * 2;
      }
    }
    _libssh2_store_u32(&local_50,uVar7);
    pcVar12 = *(char **)((long)pvVar2 + 0x18);
    *(long *)((long)pvVar2 + 0x20) = (long)local_50 - (long)pcVar12;
    *(undefined8 *)((long)pvVar2 + 0x40) = 0;
    *(undefined4 *)((long)pvVar2 + 0x38) = 1;
    sig = local_40;
  }
  else {
    pcVar12 = (char *)*puVar1;
  }
  if (*pcVar12 == '\r') {
    if (*(long *)((long)pvVar2 + 0x10) != 0) {
      local_40 = sig;
      iVar6 = (**(code **)(*(long *)((long)pvVar2 + 0x10) + 8))(pvVar2,puVar1);
      if (iVar6 == 0) {
        (*session->free)(*(void **)((long)pvVar2 + 0x18),&session->abstract);
        *(undefined8 *)((long)pvVar2 + 0x18) = 0;
        puVar11 = *(uchar **)((long)pvVar2 + 0x28);
        uVar5 = *(ulong *)((long)pvVar2 + 0x30);
        iVar6 = -0x2a;
        local_50 = puVar11;
        if ((((0 < (long)uVar5) && (*puVar11 == '\x0e')) && (local_50 = puVar11 + 1, 4 < uVar5)) &&
           (local_50 = puVar11 + 5, 8 < uVar5)) {
          uVar7 = _libssh2_ntohu32(local_50);
          local_50 = local_50 + 4;
          __n = (ulong)uVar7;
          uVar13 = (uVar5 - __n) - 9;
          if (-1 < (long)uVar13) {
            __dest = (size_t *)(*session->alloc)(__n,&session->abstract);
            if (__dest == (size_t *)0x0) {
              iVar6 = -6;
            }
            else {
              local_48 = __dest;
              memcpy(__dest,local_50,__n);
              local_50 = local_50 + __n;
              sVar10 = plain_method((char *)session->userauth_pblc_method,
                                    session->userauth_pblc_method_len);
              iVar6 = -0x33;
              if (((session->userauth_pblc_method_len == __n) || (sVar10 == __n)) &&
                 ((iVar8 = bcmp(local_48,session->userauth_pblc_method,__n), iVar8 == 0 &&
                  (iVar6 = -0x2a, 3 < uVar13)))) {
                uVar7 = _libssh2_ntohu32(local_50);
                uVar13 = (ulong)uVar7;
                *sig_len = uVar13;
                local_50 = local_50 + 4;
                if (uVar13 <= (uVar5 - __n) - 0xd) {
                  puVar11 = (uchar *)(*session->alloc)(uVar13,&session->abstract);
                  *local_40 = puVar11;
                  if (puVar11 == (uchar *)0x0) {
                    iVar6 = -6;
                  }
                  else {
                    memcpy(puVar11,local_50,*sig_len);
                    iVar6 = 0;
                  }
                }
              }
              (*session->free)(local_48,&session->abstract);
            }
          }
        }
      }
      (*session->free)(*(void **)((long)pvVar2 + 0x18),&session->abstract);
      *(undefined8 *)((long)pvVar2 + 0x18) = 0;
      (*session->free)(*(void **)((long)pvVar2 + 0x28),&session->abstract);
      *(undefined8 *)((long)pvVar2 + 0x28) = 0;
      *(undefined4 *)((long)pvVar2 + 0x38) = 0;
      pcVar12 = "agent sign failure";
      goto LAB_00107ffa;
    }
    pcVar12 = "agent not connected";
  }
  else {
    pcVar12 = "illegal request";
  }
  iVar6 = -0x27;
LAB_00107ffa:
  iVar6 = _libssh2_error(session,iVar6,pcVar12);
  return iVar6;
}

Assistant:

static int
agent_sign(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
           const unsigned char *data, size_t data_len, void **abstract)
{
    LIBSSH2_AGENT *agent = (LIBSSH2_AGENT *) (*abstract);
    agent_transaction_ctx_t transctx = &agent->transctx;
    struct agent_publickey *identity = agent->identity;
    ssize_t len = 1 + 4 + identity->external.blob_len + 4 + data_len + 4;
    ssize_t method_len;
    unsigned char *s;
    int rc;
    unsigned char *method_name = NULL;
    uint32_t sign_flags = 0;
    ssize_t plain_len;

    /* Create a request to sign the data */
    if(transctx->state == agent_NB_state_init) {
        s = transctx->request = LIBSSH2_ALLOC(session, len);
        if(!transctx->request)
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "out of memory");

        *s++ = SSH2_AGENTC_SIGN_REQUEST;
        /* key blob */
        _libssh2_store_str(&s, (const char *)identity->external.blob,
                           identity->external.blob_len);
        /* data */
        _libssh2_store_str(&s, (const char *)data, data_len);

        /* flags */
        if(session->userauth_pblc_method_len > 0 &&
            session->userauth_pblc_method) {
            if(session->userauth_pblc_method_len == 12 &&
                !memcmp(session->userauth_pblc_method, "rsa-sha2-512", 12)) {
                sign_flags = SSH_AGENT_RSA_SHA2_512;
            }
            else if(session->userauth_pblc_method_len == 12 &&
                !memcmp(session->userauth_pblc_method, "rsa-sha2-256", 12)) {
                sign_flags = SSH_AGENT_RSA_SHA2_256;
            }
        }
        _libssh2_store_u32(&s, sign_flags);

        transctx->request_len = s - transctx->request;
        transctx->send_recv_total = 0;
        transctx->state = agent_NB_state_request_created;
    }

    /* Make sure to be re-called as a result of EAGAIN. */
    if(*transctx->request != SSH2_AGENTC_SIGN_REQUEST)
        return _libssh2_error(session, LIBSSH2_ERROR_BAD_USE,
                              "illegal request");

    if(!agent->ops)
        /* if no agent has been connected, bail out */
        return _libssh2_error(session, LIBSSH2_ERROR_BAD_USE,
                              "agent not connected");

    rc = agent->ops->transact(agent, transctx);
    if(rc) {
        goto error;
    }
    LIBSSH2_FREE(session, transctx->request);
    transctx->request = NULL;

    len = transctx->response_len;
    s = transctx->response;
    len--;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    if(*s != SSH2_AGENT_SIGN_RESPONSE) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    s++;

    /* Skip the entire length of the signature */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    s += 4;

    /* Skip signing method */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    method_len = _libssh2_ntohu32(s);
    s += 4;
    len -= method_len;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }

    /* method name */
    method_name = LIBSSH2_ALLOC(session, method_len);
    if(!method_name) {
        rc = LIBSSH2_ERROR_ALLOC;
        goto error;
    }
    memcpy(method_name, s, method_len);
    s += method_len;

    plain_len = plain_method((char *)session->userauth_pblc_method,
                             session->userauth_pblc_method_len);

    /* check to see if we match requested */
    if(((size_t)method_len != session->userauth_pblc_method_len &&
        method_len != plain_len) ||
       memcmp(method_name, session->userauth_pblc_method, method_len)) {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_KEX,
                       "Agent sign method %.*s",
                       (int)method_len, method_name));

        rc = LIBSSH2_ERROR_ALGO_UNSUPPORTED;
        goto error;
    }

    /* Read the signature */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    *sig_len = _libssh2_ntohu32(s);
    s += 4;
    len -= *sig_len;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }

    *sig = LIBSSH2_ALLOC(session, *sig_len);
    if(!*sig) {
        rc = LIBSSH2_ERROR_ALLOC;
        goto error;
    }
    memcpy(*sig, s, *sig_len);

error:

    if(method_name)
        LIBSSH2_FREE(session, method_name);

    LIBSSH2_FREE(session, transctx->request);
    transctx->request = NULL;

    LIBSSH2_FREE(session, transctx->response);
    transctx->response = NULL;

    transctx->state = agent_NB_state_init;

    return _libssh2_error(session, rc, "agent sign failure");
}